

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O3

Symbol * __thiscall
slang::ast::anon_unknown_287::recursePrimArray
          (anon_unknown_287 *this,Compilation *comp,PrimitiveSymbol *primitive,
          HierarchicalInstanceSyntax *instance,ASTContext *context,DimIterator it,DimIterator end,
          span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL>
          attributes,SmallVectorBase<unsigned_int> *path)

{
  SourceLocation SVar1;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> attributes_00;
  pointer ppSVar2;
  uint uVar3;
  int iVar4;
  Diagnostic *pDVar5;
  InstanceArraySymbol *pIVar6;
  Symbol *pSVar7;
  undefined4 extraout_var;
  int iVar8;
  EVP_PKEY_CTX *src;
  int iVar9;
  long lVar10;
  long lVar11;
  SourceRange sourceRange;
  string_view sVar12;
  Symbol *symbol;
  Token nameToken;
  ConstantRange range;
  SmallVector<const_slang::ast::Symbol_*,_5UL> elements;
  EvaluatedDimension dim;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff00;
  SmallVectorBase<unsigned_int> *in_stack_ffffffffffffff10;
  ConstantRange local_e0;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  span<const_slang::ast::Symbol_*,_18446744073709551615UL> local_c8;
  Token local_b8;
  VariableDimensionSyntax *local_a8;
  Compilation *local_a0;
  ConstantRange local_98;
  SmallVectorBase<const_slang::ast::Symbol_*> local_90 [2];
  EvaluatedDimension local_50;
  
  local_90[0].len = (size_type)local_90[0].data_;
  if (context == (ASTContext *)it._M_current) {
    attributes_00._M_extent._M_extent_value = in_stack_ffffffffffffff00._M_extent_value;
    attributes_00._M_ptr = (pointer)attributes._M_extent._M_extent_value;
    pIVar6 = (InstanceArraySymbol *)
             createPrimInst(this,*(Compilation **)&instance->super_SyntaxNode,(Scope *)comp,
                            primitive,(HierarchicalInstanceSyntax *)end._M_current,attributes_00,
                            (SmallVectorBase<unsigned_int> *)attributes._M_ptr);
  }
  else {
    SVar1 = (primitive->super_Symbol).location;
    local_b8._0_8_ = *(undefined8 *)((long)SVar1 + 0x18);
    local_b8.info = *(Info **)((long)SVar1 + 0x20);
    local_a8 = (VariableDimensionSyntax *)(context->scope).ptr;
    ASTContext::evalDimension(&local_50,(ASTContext *)instance,local_a8,true,false);
    if (local_50.kind - Range < 2) {
      iVar8 = local_50.range.left;
      iVar9 = local_50.range.right;
      iVar4 = iVar8 - iVar9;
      if (iVar8 - iVar9 == 0 || iVar8 < iVar9) {
        iVar4 = -(iVar8 - iVar9);
      }
      local_98 = local_50.range;
      local_a0 = comp;
      if (iVar4 + 1U <= *(uint *)(this + 0x30)) {
        local_90[0].len = 0;
        local_90[0].data_ = (pointer)((long)local_90 + 0x18);
        local_90[0].cap = 5;
        local_c8._M_ptr._0_4_ = 0;
        uVar3 = (uint)local_c8._M_ptr;
        local_c8._M_ptr._0_4_ = 0;
        if (iVar4 != -1) {
          do {
            SmallVectorBase<unsigned_int>::emplace_back<unsigned_int_const&>
                      ((SmallVectorBase<unsigned_int> *)attributes._M_extent._M_extent_value,
                       (uint *)&local_c8);
            pSVar7 = recursePrimArray(this,local_a0,primitive,instance,
                                      (ASTContext *)&context->lookupIndex,it,end,attributes,
                                      in_stack_ffffffffffffff10);
            local_d8._M_len = (size_t)pSVar7;
            *(long *)(attributes._M_extent._M_extent_value + 8) =
                 *(long *)(attributes._M_extent._M_extent_value + 8) + -1;
            (pSVar7->name)._M_len = 0;
            (pSVar7->name)._M_str = "";
            SmallVectorBase<slang::ast::Symbol_const*>::
            emplace_back<slang::ast::Symbol_const*const&>
                      ((SmallVectorBase<slang::ast::Symbol_const*> *)local_90,(Symbol **)&local_d8);
            local_c8._M_ptr._0_4_ = (uint)local_c8._M_ptr + 1;
            uVar3 = (uint)local_c8._M_ptr;
          } while ((uint)local_c8._M_ptr < iVar4 + 1U);
        }
        local_c8._M_ptr._0_4_ = uVar3;
        local_d8 = parsing::Token::valueText(&local_b8);
        local_e0 = (ConstantRange)parsing::Token::location(&local_b8);
        iVar4 = SmallVectorBase<const_slang::ast::Symbol_*>::copy(local_90,(EVP_PKEY_CTX *)this,src)
        ;
        local_c8._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
        pIVar6 = BumpAllocator::
                 emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,std::span<slang::ast::Symbol_const*,18446744073709551615ul>,slang::ConstantRange&>
                           ((BumpAllocator *)this,(Compilation *)this,&local_d8,
                            (SourceLocation *)&local_e0,&local_c8,&local_98);
        ppSVar2 = local_90[0].data_;
        if ((char *)local_90[0].len != (char *)0x0) {
          lVar10 = local_90[0].len << 3;
          lVar11 = 0;
          do {
            Scope::insertMember(&pIVar6->super_Scope,*(Symbol **)((long)ppSVar2 + lVar11),
                                (pIVar6->super_Scope).lastMember,false,true);
            lVar11 = lVar11 + 8;
          } while (lVar10 != lVar11);
        }
        if (local_90[0].data_ == (pointer)((long)local_90 + 0x18U)) {
          return &pIVar6->super_Symbol;
        }
        operator_delete(local_90[0].data_);
        return &pIVar6->super_Symbol;
      }
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&local_a8->super_SyntaxNode);
      pDVar5 = ASTContext::addDiag((ASTContext *)instance,(DiagCode)0x6d0006,sourceRange);
      sVar12._M_str = "primitive";
      sVar12._M_len = 9;
      pDVar5 = Diagnostic::operator<<(pDVar5,sVar12);
      local_90[0].data_ = (pointer)(ulong)*(uint *)(this + 0x30);
      std::
      vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
      ::emplace_back<unsigned_long>(&pDVar5->args,(unsigned_long *)local_90);
      sVar12 = parsing::Token::valueText(&local_b8);
      local_c8._M_ptr = (pointer)parsing::Token::location(&local_b8);
      local_90[0]._0_16_ = (undefined1  [16])sVar12;
    }
    else {
      sVar12 = parsing::Token::valueText(&local_b8);
      local_c8._M_ptr = (pointer)parsing::Token::location(&local_b8);
      local_90[0]._0_16_ = (undefined1  [16])sVar12;
    }
    local_d8 = (basic_string_view<char,_std::char_traits<char>_>)ZEXT816(0);
    local_e0.left = 0;
    local_e0.right = 0;
    pIVar6 = BumpAllocator::
             emplace<slang::ast::InstanceArraySymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,std::span<slang::ast::Symbol_const*const,18446744073709551615ul>,slang::ConstantRange>
                       ((BumpAllocator *)this,(Compilation *)this,
                        (basic_string_view<char,_std::char_traits<char>_> *)local_90,
                        (SourceLocation *)&local_c8,
                        (span<const_slang::ast::Symbol_*const,_18446744073709551615UL> *)&local_d8,
                        &local_e0);
  }
  return &pIVar6->super_Symbol;
}

Assistant:

Symbol* recursePrimArray(Compilation& comp, const PrimitiveSymbol& primitive,
                         const HierarchicalInstanceSyntax& instance, const ASTContext& context,
                         DimIterator it, DimIterator end,
                         std::span<const AttributeInstanceSyntax* const> attributes,
                         SmallVectorBase<uint32_t>& path) {
    if (it == end)
        return createPrimInst(comp, *context.scope, primitive, instance, attributes, path);

    SLANG_ASSERT(instance.decl);
    auto nameToken = instance.decl->name;
    auto& dimSyntax = **it;
    ++it;

    // Evaluate the dimensions of the array. If this fails for some reason,
    // make up an empty array so that we don't get further errors when
    // things try to reference this symbol.
    auto dim = context.evalDimension(dimSyntax, /* requireRange */ true, /* isPacked */ false);
    if (!dim.isRange())
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());

    ConstantRange range = dim.range;
    if (range.width() > comp.getOptions().maxInstanceArray) {
        auto& diag = context.addDiag(diag::MaxInstanceArrayExceeded, dimSyntax.sourceRange());
        diag << "primitive"sv << comp.getOptions().maxInstanceArray;
        return &InstanceArraySymbol::createEmpty(comp, nameToken.valueText(), nameToken.location());
    }

    SmallVector<const Symbol*> elements;
    for (uint32_t i = 0; i < range.width(); i++) {
        path.push_back(i);
        auto symbol = recursePrimArray(comp, primitive, instance, context, it, end, attributes,
                                       path);
        path.pop_back();

        symbol->name = "";
        elements.push_back(symbol);
    }

    auto result = comp.emplace<InstanceArraySymbol>(comp, nameToken.valueText(),
                                                    nameToken.location(), elements.copy(comp),
                                                    range);
    for (auto element : elements)
        result->addMember(*element);

    return result;
}